

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZSTD_loadDictionaryContent
                 (ZSTD_matchState_t *ms,ldmState_t *ls,ZSTD_cwksp *ws,ZSTD_CCtx_params *params,
                 void *src,size_t srcSize,ZSTD_dictTableLoadMethod_e dtlm,
                 ZSTD_tableFillPurpose_e tfp)

{
  BYTE *iend;
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  ZSTD_compressionParameters cParams1;
  ZSTD_compressionParameters cParams2;
  long *plVar14;
  int iVar15;
  uint uVar16;
  U32 UVar17;
  ZSTD_strategy ZVar18;
  ulong uVar19;
  size_t sVar20;
  size_t extraout_RAX;
  size_t extraout_RAX_00;
  undefined4 extraout_var;
  size_t extraout_RAX_01;
  size_t extraout_RAX_02;
  size_t extraout_RAX_03;
  byte bVar21;
  BYTE *pBVar22;
  BYTE *pBVar23;
  U32 UVar24;
  BYTE *pBVar25;
  ulong uVar26;
  ulong uVar27;
  ulong *puVar28;
  ldmState_t *ldmState;
  uint uVar29;
  BYTE *ip;
  long lVar30;
  BYTE *ip_00;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff94;
  ZSTD_strategy ZVar35;
  undefined4 uStack_64;
  undefined4 uStack_48;
  
  bVar32 = (params->ldmParams).enableLdm != ZSTD_ps_enable;
  ZVar35 = (ZSTD_strategy)ls;
  uStack_64 = (undefined4)((ulong)ls >> 0x20);
  bVar33 = ls == (ldmState_t *)0x0;
  uVar3 = (params->cParams).hashLog;
  uVar4 = (params->cParams).searchLog;
  cParams1.chainLog = uVar4;
  cParams1.windowLog = uVar3;
  uVar5 = (params->cParams).minMatch;
  uVar6 = (params->cParams).targetLength;
  uVar7 = (params->cParams).strategy;
  cParams1.minMatch = uVar7;
  cParams1.searchLog = uVar6;
  uVar8 = (ms->cParams).windowLog;
  uVar9 = (ms->cParams).hashLog;
  uVar10 = (ms->cParams).searchLog;
  cParams2.chainLog = uVar10;
  cParams2.windowLog = uVar9;
  uVar11 = (ms->cParams).minMatch;
  uVar12 = (ms->cParams).targetLength;
  uVar13 = (ms->cParams).strategy;
  cParams2.minMatch = uVar13;
  cParams2.searchLog = uVar12;
  cParams1.hashLog = uVar5;
  cParams1.targetLength = in_stack_ffffffffffffff74;
  cParams1.strategy = uVar8;
  cParams2.hashLog = uVar11;
  cParams2.targetLength = in_stack_ffffffffffffff94;
  cParams2.strategy = ZVar35;
  ZSTD_assertEqualCParams(cParams1,cParams2);
  ZVar18 = (params->cParams).strategy;
  bVar31 = 0xfffffffd < ZVar18 - ZSTD_greedy;
  bVar34 = tfp == ZSTD_tfp_forCDict;
  if ((bVar34 && bVar31) && (!bVar33 && !bVar32)) {
    __assert_fail("!loadLdmDict",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x6322,
                  "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                 );
  }
  iend = (BYTE *)((long)src + srcSize);
  lVar30 = -0xfffffe;
  if (!bVar34 || !bVar31) {
    lVar30 = -0xdffffffe;
  }
  uVar27 = 0xfffffe;
  if (!bVar34 || !bVar31) {
    uVar27 = 0xdffffffe;
  }
  ip_00 = iend + lVar30;
  if (srcSize <= uVar27) {
    ip_00 = (BYTE *)src;
    uVar27 = srcSize;
  }
  iVar15 = (int)iend;
  if (uVar27 < 0x20000000) {
    if (srcSize != 0) {
      pBVar22 = (ms->window).base;
      goto LAB_00195009;
    }
    if (bVar33 || bVar32) goto LAB_0019516b;
  }
  else {
    plVar14 = (long *)CONCAT44(uStack_64,ZVar35);
    if (((ms->window).dictLimit != 2) || ((ms->window).lowLimit != 2)) {
LAB_00195349:
      __assert_fail("ZSTD_window_isEmpty(ms->window)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x632f,
                    "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                   );
    }
    pBVar23 = (ms->window).nextSrc;
    pBVar22 = (ms->window).base;
    if ((long)pBVar23 - (long)pBVar22 != 2) goto LAB_00195349;
    if (bVar33 || bVar32) {
      if (pBVar22 == (BYTE *)0x0) goto LAB_001952cd;
      pBVar25 = (ms->window).dictBase;
      if (pBVar25 != (BYTE *)0x0) {
        if (pBVar23 != ip_00) {
          (ms->window).dictLimit = 2;
          (ms->window).lowLimit = 2;
          (ms->window).dictBase = pBVar22;
          (ms->window).base = ip_00 + -2;
          pBVar25 = pBVar22;
        }
        pBVar22 = ip_00 + uVar27;
        (ms->window).nextSrc = pBVar22;
        if (ip_00 < pBVar25 + 2 && pBVar25 + 2 < pBVar22) {
          UVar17 = 2;
          if ((long)pBVar22 - (long)pBVar25 < 2) {
            UVar17 = (U32)((long)pBVar22 - (long)pBVar25);
          }
          (ms->window).lowLimit = UVar17;
        }
        goto LAB_0019516b;
      }
      goto LAB_001952ec;
    }
    if ((((int)plVar14[3] != 2) || (*(int *)((long)plVar14 + 0x1c) != 2)) ||
       (*plVar14 - plVar14[1] != 2)) {
      __assert_fail("ZSTD_window_isEmpty(ls->window)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x6330,
                    "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                   );
    }
LAB_00195009:
    puVar28 = (ulong *)CONCAT44(uStack_64,ZVar35);
    if (pBVar22 == (BYTE *)0x0) {
LAB_001952cd:
      __assert_fail("window->base != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x48d8,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
    }
    pBVar23 = (ms->window).dictBase;
    if (pBVar23 == (BYTE *)0x0) {
LAB_001952ec:
      __assert_fail("window->dictBase != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x48d9,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
    }
    pBVar25 = (ms->window).nextSrc;
    if (pBVar25 == ip_00) {
      uVar26 = (ulong)(ms->window).dictLimit;
      pBVar22 = pBVar23;
      UVar17 = (ms->window).lowLimit;
    }
    else {
      uVar26 = (long)pBVar25 - (long)pBVar22;
      UVar17 = (ms->window).dictLimit;
      (ms->window).lowLimit = UVar17;
      if (uVar26 >> 0x20 != 0) goto LAB_0019532a;
      UVar24 = (U32)uVar26;
      (ms->window).dictLimit = UVar24;
      (ms->window).dictBase = pBVar22;
      (ms->window).base = ip_00 + -uVar26;
      if (UVar24 - UVar17 < 8) {
        (ms->window).lowLimit = UVar24;
        UVar17 = UVar24;
      }
    }
    pBVar23 = ip_00 + uVar27;
    (ms->window).nextSrc = pBVar23;
    if ((pBVar22 + UVar17 < pBVar23) && (ip_00 < pBVar22 + (uVar26 & 0xffffffff))) {
      UVar17 = (U32)((long)pBVar23 - (long)pBVar22);
      if ((long)(uVar26 & 0xffffffff) < (long)pBVar23 - (long)pBVar22) {
        UVar17 = (U32)uVar26;
      }
      (ms->window).lowLimit = UVar17;
    }
    if (bVar33 || bVar32) goto LAB_0019516b;
    uVar26 = puVar28[1];
    if (uVar26 == 0) goto LAB_001952cd;
    if (puVar28[2] == 0) goto LAB_001952ec;
    if ((BYTE *)*puVar28 == ip_00) {
      uVar19 = (ulong)(uint)puVar28[3];
      uVar26 = puVar28[2];
      uVar29 = *(uint *)((long)puVar28 + 0x1c);
    }
    else {
      uVar19 = (long)*puVar28 - uVar26;
      uVar29 = (uint)puVar28[3];
      *(uint *)((long)puVar28 + 0x1c) = uVar29;
      if (uVar19 >> 0x20 != 0) {
LAB_0019532a:
        __assert_fail("distanceFromBase == (size_t)(U32)distanceFromBase",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x48e0,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
      }
      uVar16 = (uint)uVar19;
      *(uint *)(puVar28 + 3) = uVar16;
      puVar28[2] = uVar26;
      puVar28[1] = (long)ip_00 - uVar19;
      if (uVar16 - uVar29 < 8) {
        *(uint *)((long)puVar28 + 0x1c) = uVar16;
        uVar29 = uVar16;
      }
    }
    *puVar28 = (ulong)pBVar23;
    if (((BYTE *)(uVar29 + uVar26) < pBVar23) && (ip_00 < (BYTE *)(uVar26 + (uVar19 & 0xffffffff))))
    {
      uVar2 = (undefined4)((long)pBVar23 - uVar26);
      if ((long)(uVar19 & 0xffffffff) < (long)((long)pBVar23 - uVar26)) {
        uVar2 = (undefined4)uVar19;
      }
      *(undefined4 *)((long)puVar28 + 0x1c) = uVar2;
    }
  }
  ldmState = (ldmState_t *)CONCAT44(uStack_64,ZVar35);
  UVar17 = 0;
  if (params->forceWindow == 0) {
    UVar17 = iVar15 - *(int *)&(ldmState->window).base;
  }
  ldmState->loadedDictEnd = UVar17;
  ZSTD_ldm_fillHashTable(ldmState,ip_00,iend,&params->ldmParams);
  ZVar18 = (params->cParams).strategy;
LAB_0019516b:
  if (ZVar18 < ZSTD_btultra) {
    uVar29 = (params->cParams).chainLog;
    uVar16 = (params->cParams).hashLog;
    if (uVar29 < uVar16) {
      uVar29 = uVar16;
    }
    bVar21 = 0x1c;
    if (uVar29 < 0x1c) {
      bVar21 = (byte)uVar29;
    }
    uVar26 = (ulong)(uint)(8 << (bVar21 & 0x1f));
    if (uVar26 < uVar27) {
      ip_00 = iend + -uVar26;
    }
    if (uVar26 <= uVar27) {
      uVar27 = uVar26;
    }
  }
  iVar1 = *(int *)&(ms->window).base;
  ms->nextToUpdate = (int)ip_00 - iVar1;
  UVar17 = 0;
  if (params->forceWindow == 0) {
    UVar17 = iVar15 - iVar1;
  }
  ms->loadedDictEnd = UVar17;
  sVar20 = (size_t)(uint)params->deterministicRefPrefix;
  ms->forceNonContiguous = params->deterministicRefPrefix;
  if (8 < uVar27) {
    ZSTD_overflowCorrectIfNeeded(ms,ws,params,ip_00,iend);
    switch((params->cParams).strategy) {
    case ZSTD_fast:
      ZSTD_fillHashTable(ms,iend,dtlm,tfp);
      sVar20 = extraout_RAX_01;
      break;
    case ZSTD_dfast:
      ZSTD_fillDoubleHashTable(ms,iend,dtlm,tfp);
      sVar20 = extraout_RAX_02;
      break;
    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
      if (ms->dedicatedDictSearch == 0) {
        if (params->useRowMatchFinder == ZSTD_ps_enable) {
          memset(ms->tagTable,0,1L << ((byte)(params->cParams).hashLog & 0x3f));
          ZSTD_row_update(ms,iend + -8);
          sVar20 = extraout_RAX_03;
        }
        else {
          if (params->useRowMatchFinder == ZSTD_ps_auto) {
            __assert_fail("params->useRowMatchFinder != ZSTD_ps_auto",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x635f,
                          "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                         );
          }
          UVar17 = ZSTD_insertAndFindFirstIndex(ms,iend + -8);
          sVar20 = CONCAT44(extraout_var,UVar17);
        }
      }
      else {
        if (ms->chainTable == (U32 *)0x0) {
          __assert_fail("ms->chainTable != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x635c,
                        "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                       );
        }
        ZSTD_dedicatedDictSearch_lazy_loadDictionary(ms,iend + -8);
        sVar20 = extraout_RAX_00;
      }
      break;
    case ZSTD_btlazy2:
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
      ZSTD_updateTree(ms,iend + -8,iend);
      sVar20 = extraout_RAX;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x6375,
                    "size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e)"
                   );
    }
    ms->nextToUpdate = iVar15 - *(int *)&(ms->window).base;
  }
  return sVar20;
}

Assistant:

static size_t ZSTD_loadDictionaryContent(ZSTD_matchState_t* ms,
                                         ldmState_t* ls,
                                         ZSTD_cwksp* ws,
                                         ZSTD_CCtx_params const* params,
                                         const void* src, size_t srcSize,
                                         ZSTD_dictTableLoadMethod_e dtlm,
                                         ZSTD_tableFillPurpose_e tfp)
{
    const BYTE* ip = (const BYTE*) src;
    const BYTE* const iend = ip + srcSize;
    int const loadLdmDict = params->ldmParams.enableLdm == ZSTD_ps_enable && ls != NULL;

    /* Assert that the ms params match the params we're being given */
    ZSTD_assertEqualCParams(params->cParams, ms->cParams);

    {   /* Ensure large dictionaries can't cause index overflow */

        /* Allow the dictionary to set indices up to exactly ZSTD_CURRENT_MAX.
         * Dictionaries right at the edge will immediately trigger overflow
         * correction, but I don't want to insert extra constraints here.
         */
        U32 maxDictSize = ZSTD_CURRENT_MAX - ZSTD_WINDOW_START_INDEX;

        int const CDictTaggedIndices = ZSTD_CDictIndicesAreTagged(&params->cParams);
        if (CDictTaggedIndices && tfp == ZSTD_tfp_forCDict) {
            /* Some dictionary matchfinders in zstd use "short cache",
             * which treats the lower ZSTD_SHORT_CACHE_TAG_BITS of each
             * CDict hashtable entry as a tag rather than as part of an index.
             * When short cache is used, we need to truncate the dictionary
             * so that its indices don't overlap with the tag. */
            U32 const shortCacheMaxDictSize = (1u << (32 - ZSTD_SHORT_CACHE_TAG_BITS)) - ZSTD_WINDOW_START_INDEX;
            maxDictSize = MIN(maxDictSize, shortCacheMaxDictSize);
            assert(!loadLdmDict);
        }

        /* If the dictionary is too large, only load the suffix of the dictionary. */
        if (srcSize > maxDictSize) {
            ip = iend - maxDictSize;
            src = ip;
            srcSize = maxDictSize;
        }
    }

    if (srcSize > ZSTD_CHUNKSIZE_MAX) {
        /* We must have cleared our windows when our source is this large. */
        assert(ZSTD_window_isEmpty(ms->window));
        if (loadLdmDict) assert(ZSTD_window_isEmpty(ls->window));
    }
    ZSTD_window_update(&ms->window, src, srcSize, /* forceNonContiguous */ 0);

    DEBUGLOG(4, "ZSTD_loadDictionaryContent(): useRowMatchFinder=%d", (int)params->useRowMatchFinder);

    if (loadLdmDict) { /* Load the entire dict into LDM matchfinders. */
        ZSTD_window_update(&ls->window, src, srcSize, /* forceNonContiguous */ 0);
        ls->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ls->window.base);
        ZSTD_ldm_fillHashTable(ls, ip, iend, &params->ldmParams);
    }

    /* If the dict is larger than we can reasonably index in our tables, only load the suffix. */
    if (params->cParams.strategy < ZSTD_btultra) {
        U32 maxDictSize = 8U << MIN(MAX(params->cParams.hashLog, params->cParams.chainLog), 28);
        if (srcSize > maxDictSize) {
            ip = iend - maxDictSize;
            src = ip;
            srcSize = maxDictSize;
        }
    }

    ms->nextToUpdate = (U32)(ip - ms->window.base);
    ms->loadedDictEnd = params->forceWindow ? 0 : (U32)(iend - ms->window.base);
    ms->forceNonContiguous = params->deterministicRefPrefix;

    if (srcSize <= HASH_READ_SIZE) return 0;

    ZSTD_overflowCorrectIfNeeded(ms, ws, params, ip, iend);

    switch(params->cParams.strategy)
    {
    case ZSTD_fast:
        ZSTD_fillHashTable(ms, iend, dtlm, tfp);
        break;
    case ZSTD_dfast:
        ZSTD_fillDoubleHashTable(ms, iend, dtlm, tfp);
        break;

    case ZSTD_greedy:
    case ZSTD_lazy:
    case ZSTD_lazy2:
        assert(srcSize >= HASH_READ_SIZE);
        if (ms->dedicatedDictSearch) {
            assert(ms->chainTable != NULL);
            ZSTD_dedicatedDictSearch_lazy_loadDictionary(ms, iend-HASH_READ_SIZE);
        } else {
            assert(params->useRowMatchFinder != ZSTD_ps_auto);
            if (params->useRowMatchFinder == ZSTD_ps_enable) {
                size_t const tagTableSize = ((size_t)1 << params->cParams.hashLog);
                ZSTD_memset(ms->tagTable, 0, tagTableSize);
                ZSTD_row_update(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using row-based hash table for lazy dict");
            } else {
                ZSTD_insertAndFindFirstIndex(ms, iend-HASH_READ_SIZE);
                DEBUGLOG(4, "Using chain-based hash table for lazy dict");
            }
        }
        break;

    case ZSTD_btlazy2:   /* we want the dictionary table fully sorted */
    case ZSTD_btopt:
    case ZSTD_btultra:
    case ZSTD_btultra2:
        assert(srcSize >= HASH_READ_SIZE);
        ZSTD_updateTree(ms, iend-HASH_READ_SIZE, iend);
        break;

    default:
        assert(0);  /* not possible : not a valid strategy id */
    }

    ms->nextToUpdate = (U32)(iend - ms->window.base);
    return 0;
}